

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::NetAliasSyntax::NetAliasSyntax
          (NetAliasSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token keyword,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *nets,Token semi)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  iterator_base<slang::syntax::ExpressionSyntax_*> local_30;
  
  uVar5 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,NetAlias,attributes);
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  SVar2 = (nets->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(nets->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->nets).super_SyntaxListBase.super_SyntaxNode.parent =
       (nets->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->nets).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->nets).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->nets).super_SyntaxListBase.childCount = (nets->super_SyntaxListBase).childCount;
  (this->nets).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004730a0;
  sVar1 = (nets->elements).size_;
  (this->nets).elements.data_ = (nets->elements).data_;
  (this->nets).elements.size_ = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->nets).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->nets).elements.size_;
  local_30.list = &this->nets;
  for (; (local_30.list != &this->nets || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::operator*(&local_30);
    (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

NetAliasSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<ExpressionSyntax>& nets, Token semi) :
        MemberSyntax(SyntaxKind::NetAlias, attributes), keyword(keyword), nets(nets), semi(semi) {
        this->nets.parent = this;
        for (auto child : this->nets)
            child->parent = this;
    }